

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalNinjaGenerator::AppendCustomCommandLines
          (cmLocalNinjaGenerator *this,cmCustomCommandGenerator *ccg,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *cmdLines)

{
  string_view sVar1;
  undefined4 uVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  string *psVar6;
  ostream *poVar7;
  reference cmd_00;
  string *cmd;
  string local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  undefined4 local_294;
  undefined1 local_290 [8];
  string c;
  undefined1 local_268 [4];
  uint i;
  string launcher;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0 [8];
  string cdStr;
  ostringstream cdCmd;
  undefined1 local_48 [8];
  string wd;
  cmGlobalNinjaGenerator *gg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *cmdLines_local;
  cmCustomCommandGenerator *ccg_local;
  cmLocalNinjaGenerator *this_local;
  
  wd.field_2._8_8_ = GetGlobalNinjaGenerator(this);
  uVar4 = cmCustomCommandGenerator::GetNumberOfCommands(ccg);
  if (uVar4 != 0) {
    cmCustomCommandGenerator::GetWorkingDirectory_abi_cxx11_((string *)local_48,ccg);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) != 0) {
      psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
      std::__cxx11::string::operator=((string *)local_48,(string *)psVar6);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(cdStr.field_2._M_local_buf + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_1f0,"cd ",&local_1f1);
    std::allocator<char>::~allocator(&local_1f1);
    poVar7 = std::operator<<((ostream *)((long)&cdStr.field_2 + 8),local_1f0);
    sVar1 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_48);
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_218,(cmOutputConverter *)this,sVar1,SHELL,false);
    std::operator<<(poVar7,(string *)&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::ostringstream::str();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(cmdLines,(value_type *)((long)&launcher.field_2 + 8));
    std::__cxx11::string::~string((string *)(launcher.field_2._M_local_buf + 8));
    std::__cxx11::string::~string(local_1f0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(cdStr.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_48);
  }
  MakeCustomLauncher_abi_cxx11_((string *)local_268,this,ccg);
  for (c.field_2._12_4_ = 0; uVar2 = c.field_2._12_4_,
      uVar4 = cmCustomCommandGenerator::GetNumberOfCommands(ccg), uVar2 != uVar4;
      c.field_2._12_4_ = c.field_2._12_4_ + 1) {
    cmCustomCommandGenerator::GetCommand_abi_cxx11_((string *)local_290,ccg,c.field_2._12_4_);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      sVar1 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_290);
      bVar3 = (**(code **)(*(long *)wd.field_2._8_8_ + 0x140))();
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&local_2d8,(cmOutputConverter *)this,sVar1,bVar3 & NINJAMULTI,false);
      std::operator+(&local_2b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268,
                     &local_2d8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(cmdLines,&local_2b8);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_2d8);
      cmd_00 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::back(cmdLines);
      cmCustomCommandGenerator::AppendArguments(ccg,c.field_2._12_4_,cmd_00);
      local_294 = 0;
    }
    else {
      local_294 = 4;
    }
    std::__cxx11::string::~string((string *)local_290);
  }
  std::__cxx11::string::~string((string *)local_268);
  return;
}

Assistant:

void cmLocalNinjaGenerator::AppendCustomCommandLines(
  cmCustomCommandGenerator const& ccg, std::vector<std::string>& cmdLines)
{
  auto* gg = this->GetGlobalNinjaGenerator();

  if (ccg.GetNumberOfCommands() > 0) {
    std::string wd = ccg.GetWorkingDirectory();
    if (wd.empty()) {
      wd = this->GetCurrentBinaryDirectory();
    }

    std::ostringstream cdCmd;
#ifdef _WIN32
    std::string cdStr = "cd /D ";
#else
    std::string cdStr = "cd ";
#endif
    cdCmd << cdStr
          << this->ConvertToOutputFormat(wd, cmOutputConverter::SHELL);
    cmdLines.push_back(cdCmd.str());
  }

  std::string launcher = this->MakeCustomLauncher(ccg);

  for (unsigned i = 0; i != ccg.GetNumberOfCommands(); ++i) {
    std::string c = ccg.GetCommand(i);
    if (c.empty()) {
      continue;
    }
    cmdLines.push_back(launcher +
                       this->ConvertToOutputFormat(
                         c,
                         gg->IsMultiConfig() ? cmOutputConverter::NINJAMULTI
                                             : cmOutputConverter::SHELL));

    std::string& cmd = cmdLines.back();
    ccg.AppendArguments(i, cmd);
  }
}